

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QDockAreaLayoutItem>::assign<QDockAreaLayoutItem_const*,q20::identity>
          (void *param_1,long param_2,long param_3)

{
  long lVar1;
  bool bVar2;
  QDockAreaLayoutItem *pQVar3;
  qsizetype qVar4;
  QGenericArrayOps<QDockAreaLayoutItem> *this;
  QDockAreaLayoutItem *this_00;
  __off_t __length;
  long in_FS_OFFSET;
  QDockAreaLayoutItem *dend;
  QDockAreaLayoutItem *dst;
  QDockAreaLayoutItem *prependBufferEnd;
  QDockAreaLayoutItem *capacityBegin;
  qsizetype offset;
  qsizetype n;
  bool IsIdentity;
  bool IsFwdIt;
  QArrayDataPointer<QDockAreaLayoutItem> allocated;
  QDockAreaLayoutItem *in_stack_ffffffffffffff58;
  QDockAreaLayoutItem *in_stack_ffffffffffffff60;
  QDockAreaLayoutItem *in_stack_ffffffffffffff68;
  QDockAreaLayoutItem *in_stack_ffffffffffffff70;
  QDockAreaLayoutItem *in_stack_ffffffffffffff78;
  QDockAreaLayoutItem *local_70;
  long local_58;
  long local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QDockAreaLayoutItem *)
           std::distance<QDockAreaLayoutItem_const*>
                     (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  bVar2 = needsDetach((QArrayDataPointer<QDockAreaLayoutItem> *)in_stack_ffffffffffffff60);
  if ((bVar2) ||
     (qVar4 = constAllocatedCapacity
                        ((QArrayDataPointer<QDockAreaLayoutItem> *)in_stack_ffffffffffffff60),
     in_stack_ffffffffffffff78 = pQVar3, qVar4 < (long)pQVar3)) {
    detachCapacity((QArrayDataPointer<QDockAreaLayoutItem> *)in_stack_ffffffffffffff70,
                   (qsizetype)in_stack_ffffffffffffff68);
    QArrayDataPointer((QArrayDataPointer<QDockAreaLayoutItem> *)param_1,
                      (qsizetype)in_stack_ffffffffffffff78,(qsizetype)in_stack_ffffffffffffff70,
                      (AllocationOption)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    swap((QArrayDataPointer<QDockAreaLayoutItem> *)in_stack_ffffffffffffff60,
         (QArrayDataPointer<QDockAreaLayoutItem> *)in_stack_ffffffffffffff58);
    ~QArrayDataPointer((QArrayDataPointer<QDockAreaLayoutItem> *)in_stack_ffffffffffffff60);
  }
  local_58 = freeSpaceAtBegin((QArrayDataPointer<QDockAreaLayoutItem> *)in_stack_ffffffffffffff68);
  local_70 = begin((QArrayDataPointer<QDockAreaLayoutItem> *)0x604c5f);
  local_70 = local_70 + -local_58;
  pQVar3 = begin((QArrayDataPointer<QDockAreaLayoutItem> *)0x604c7c);
  if (local_58 != 0) {
    this = (QGenericArrayOps<QDockAreaLayoutItem> *)
           operator->((QArrayDataPointer<QDockAreaLayoutItem> *)param_1);
    QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::truncate(this,(char *)0x0,__length);
    setBegin((QArrayDataPointer<QDockAreaLayoutItem> *)param_1,local_70);
    local_58 = 0;
  }
  this_00 = end((QArrayDataPointer<QDockAreaLayoutItem> *)in_stack_ffffffffffffff60);
  local_38 = param_2;
  if (local_58 != 0) {
    setBegin((QArrayDataPointer<QDockAreaLayoutItem> *)param_1,local_70);
    for (; local_70 != pQVar3; local_70 = local_70 + 1) {
      if (local_38 == param_3) {
        std::destroy<QDockAreaLayoutItem*>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        pQVar3 = begin((QArrayDataPointer<QDockAreaLayoutItem> *)0x604d3d);
        ((QDockAreaLayoutItem *)param_1)->placeHolderItem =
             (QPlaceHolderItem *)(((long)local_70 - (long)pQVar3) / 0x28);
        goto LAB_00604e6a;
      }
      in_stack_ffffffffffffff68 = local_70;
      std::invoke<q20::identity&,QDockAreaLayoutItem_const&>
                ((identity *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      q20::construct_at<QDockAreaLayoutItem,QDockAreaLayoutItem_const&,void>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_38 = local_38 + 0x28;
    }
    ((QDockAreaLayoutItem *)param_1)->placeHolderItem =
         (QPlaceHolderItem *)
         ((long)&(((QDockAreaLayoutItem *)param_1)->placeHolderItem->objectName).d.d + local_58);
  }
  do {
    if (local_38 == param_3) {
      std::destroy<QDockAreaLayoutItem*>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
LAB_00604e35:
      pQVar3 = begin((QArrayDataPointer<QDockAreaLayoutItem> *)0x604e49);
      ((QDockAreaLayoutItem *)param_1)->placeHolderItem =
           (QPlaceHolderItem *)(((long)local_70 - (long)pQVar3) / 0x28);
LAB_00604e6a:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    if (local_70 == this_00) {
      local_70 = std::uninitialized_copy<QDockAreaLayoutItem_const*,QDockAreaLayoutItem*>
                           (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                            in_stack_ffffffffffffff60);
      goto LAB_00604e35;
    }
    std::invoke<q20::identity&,QDockAreaLayoutItem_const&>
              ((identity *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QDockAreaLayoutItem::operator=(this_00,(QDockAreaLayoutItem *)param_1);
    local_70 = local_70 + 1;
    local_38 = local_38 + 0x28;
  } while( true );
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }